

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRhs<0>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *con,int param_2)

{
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  double dVar5;
  type tVar6;
  bool bVar7;
  CtxVal CVar8;
  ConstraintAcceptanceLevel CVar9;
  byte bVar10;
  int v;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  VarOrConst VVar11;
  NodeRange NVar12;
  AlgConRange rng;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> lc;
  LinTerms lt;
  LinearFunctionalConstraint exprTerm;
  int local_40c;
  NLConstraint local_408;
  undefined1 local_338 [104];
  type local_2d0;
  type local_2c8;
  undefined1 local_2b8 [24];
  AlgConRhs<0> local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  ulong local_290;
  ulong local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [3];
  type local_250;
  type local_248;
  type local_240;
  undefined1 local_238 [24];
  NLConstraint local_220;
  undefined1 local_150 [72];
  int *local_108;
  ulong local_100;
  size_ty local_f8;
  int local_f0 [6];
  LinearFunctionalConstraint local_d8;
  
  local_150._0_8_ = local_150 + 0x18;
  local_150._8_8_ = 6;
  local_150._16_8_ = 0;
  local_100 = 6;
  local_108 = local_f0;
  local_f8 = 0;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (&local_d8,
             (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_LinTerms,(LinTerms *)local_150);
  dVar5 = (con->super_AlgConRhs<0>).rhs_;
  if ((((local_d8.affine_expr_.constant_term_ != 0.0) || (NAN(local_d8.affine_expr_.constant_term_))
       ) || (local_d8.affine_expr_.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size != 1)) ||
     ((*local_d8.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr != 1.0 ||
      (NAN(*local_d8.affine_expr_.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr))))) {
    if (local_d8.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0) {
      value.c_ = 2.12199579047121e-314;
    }
    else {
      CVar8 = CTX_NEG;
      if (-1e+20 < dVar5) {
        CVar8 = (dVar5 < 1e+20) + 2 + (uint)(dVar5 < 1e+20);
      }
      if (local_d8.super_FunctionalConstraint.ctx.value_ - CTX_ROOT < 2) {
        bVar7 = CVar8 - CTX_NEG < 2;
LAB_0030fad0:
        CVar8 = CTX_MIX;
        if (bVar7) {
LAB_0030fad7:
          local_d8.super_FunctionalConstraint.ctx.value_ = CVar8;
        }
      }
      else {
        if (local_d8.super_FunctionalConstraint.ctx.value_ == CTX_NONE) goto LAB_0030fad7;
        if ((local_d8.super_FunctionalConstraint.ctx.value_ == CTX_NEG) &&
           (CVar8 < (CTX_MIX|CTX_ROOT))) {
          bVar7 = (0x16U >> CVar8 & 1) != 0;
          goto LAB_0030fad0;
        }
      }
      VVar11 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AssignResult2Args<mp::LinearFunctionalConstraint>
                         ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)(this + -0x208),&local_d8);
      value = VVar11.field_1;
      if (((undefined1  [16])VVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        NVar12 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)(this + -0x208),value.c_);
        value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar12.ir_;
      }
    }
  }
  else {
    value._4_4_ = 0;
    value.var_ = *local_d8.affine_expr_.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  }
  v = value.var_;
  if (v < 0) {
LAB_0030fc79:
    bVar10 = 0;
LAB_0030fc7b:
    if ((v < 0) &&
       (CVar9 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                          ((BasicConstraintKeeper *)(this + 0xc70)),
       (bool)(~bVar10 & CVar9 == Recommended))) {
      bVar7 = false;
      goto LAB_0030ff98;
    }
    rng.ub_ = dVar5;
    rng.lb_ = dVar5;
    NLConstraint::NLConstraint(&local_408,(LinTerms *)local_150,v,rng,false);
    paVar3 = &local_220.super_BasicConstraint.name_.field_2;
    paVar1 = &local_408.super_BasicConstraint.name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.super_BasicConstraint.name_._M_dataplus._M_p == paVar1) {
      local_220.super_BasicConstraint.name_.field_2._8_8_ =
           local_408.super_BasicConstraint.name_.field_2._8_8_;
      local_220.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_220.super_BasicConstraint.name_._M_dataplus._M_p =
           local_408.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_220.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ =
         local_408.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
    local_220.super_BasicConstraint.name_.field_2._M_local_buf[0] =
         local_408.super_BasicConstraint.name_.field_2._M_local_buf[0];
    paVar2 = &local_408.lcr_.super_BasicConstraint.name_.field_2;
    paVar4 = &local_220.lcr_.super_BasicConstraint.name_.field_2;
    local_220.super_BasicConstraint.name_._M_string_length =
         local_408.super_BasicConstraint.name_._M_string_length;
    local_408.super_BasicConstraint.name_._M_string_length = 0;
    local_408.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p == paVar2) {
      local_220.lcr_.super_BasicConstraint.name_.field_2._8_8_ =
           local_408.lcr_.super_BasicConstraint.name_.field_2._8_8_;
      local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p =
           local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_220.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity;
    local_220.lcr_.super_BasicConstraint.name_._M_string_length =
         local_408.lcr_.super_BasicConstraint.name_._M_string_length;
    local_408.lcr_.super_BasicConstraint.name_._M_string_length = 0;
    local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity &
         0xffffffffffffff00;
    local_408.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
    local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
    if (local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_220.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_220.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_408.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_408.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_408.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U> + 0x18);
    }
    if (local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_220.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if ((double)local_408.lcr_.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0.0) {
        memcpy(local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
           m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
           m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_408.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U> + 0x18);
    }
    local_220.lcr_.super_AlgConRange.lb_ = local_408.lcr_.super_AlgConRange.lb_;
    local_220.lcr_.super_AlgConRange.ub_ = local_408.lcr_.super_AlgConRange.ub_;
    local_220.expr_ = local_408.expr_;
    NVar12 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddConstraintAndTryNoteResultVariable<mp::NLConstraint>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)(this + -0x208),&local_220);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)(this + -0x208),NVar12);
    if (6 < local_220.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_220.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_220.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_220.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_220.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_220.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p != paVar4) {
      operator_delete(local_220.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_220.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.super_BasicConstraint.name_._M_dataplus._M_p != paVar3) {
      operator_delete(local_220.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_220.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_408.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_408.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_408.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_408.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p != paVar2) {
      operator_delete(local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.super_BasicConstraint.name_._M_dataplus._M_p != paVar1) {
LAB_0030ff89:
      operator_delete(local_408.super_BasicConstraint.name_._M_dataplus._M_p,
                      CONCAT71(local_408.super_BasicConstraint.name_.field_2._M_allocated_capacity.
                               _1_7_,local_408.super_BasicConstraint.name_.field_2._M_local_buf[0])
                      + 1);
    }
  }
  else {
    if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= v) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 false);
    }
    CVar9 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                      ((BasicConstraintKeeper *)(this + 0x6e38));
    if (CVar9 != Recommended) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 true);
    }
    this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this + -0x208);
    bVar7 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    if (!bVar7) goto LAB_0030fc79;
    local_408.super_BasicConstraint.name_._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_40c = v;
    gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
              ((small_vector_base<std::allocator<double>,6u> *)local_150,(double *)&local_408);
    gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
              ((small_vector_base<std::allocator<int>,6u> *)&local_108,&local_40c);
    LinTerms::sort_terms((LinTerms *)local_150,true);
    if ((ulong)local_150._16_8_ < 2) {
      bVar7 = true;
      FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(this_00,v,dVar5,dVar5);
      goto LAB_0030ff98;
    }
    CVar9 = BasicConstraintKeeper::GetChosenAcceptanceLevel((BasicConstraintKeeper *)(this + 0xc70))
    ;
    if (CVar9 != Recommended) {
      v = -1;
      bVar10 = 1;
      goto LAB_0030fc7b;
    }
    gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<double>,6u> *)&local_298,local_150);
    gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<int>,6u> *)&local_250,
               (small_vector_base<std::allocator<int>,6u> *)&local_108);
    local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity = local_288;
    dVar5 = (con->super_AlgConRhs<0>).rhs_;
    paVar1 = &local_408.super_BasicConstraint.name_.field_2;
    local_408.super_BasicConstraint.name_._M_string_length = 0;
    local_408.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_408.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
    if (local_290 < 7) {
      local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)((long)&local_408.lcr_.super_BasicConstraint.name_.field_2 + 8);
      local_408.lcr_.super_BasicConstraint.name_._M_string_length = 6;
      if (local_288 != 0) {
        memcpy(local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,local_298,local_288 * 8);
      }
    }
    else {
      local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_298;
      local_408.lcr_.super_BasicConstraint.name_._M_string_length = local_290;
      local_290 = 6;
      local_288 = 0;
      local_298 = local_280;
    }
    tVar6 = local_240;
    if ((ulong)local_248 < 7) {
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[2] =
           (type)((long)&local_408.lcr_.super_LinTerms.coefs_.
                         super_small_vector_base<std::allocator<double>,_6U> + 0x40);
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[3] = (type)0x6;
      if (local_240 != (type)0x0) {
        memcpy((void *)local_408.lcr_.super_LinTerms.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data
                       [2],(void *)local_250,(long)local_240 * 4);
      }
    }
    else {
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[2] = local_250;
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[3] = local_248;
      local_248 = (type)0x6;
      local_240 = (type)0x0;
      local_250 = (type)local_238;
    }
    local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    m_storage.m_data[4] = tVar6;
    local_408.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = (size_ty)dVar5;
    if (6 < (ulong)local_248) {
      operator_delete((void *)local_250,(long)local_248 << 2);
    }
    if (6 < local_290) {
      operator_delete(local_298,local_290 << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.super_BasicConstraint.name_._M_dataplus._M_p == paVar1) {
      local_338._24_8_ = local_408.super_BasicConstraint.name_.field_2._8_8_;
      local_338._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_338 + 0x10);
    }
    else {
      local_338._0_8_ = local_408.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_338._17_7_ = local_408.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
    local_338[0x10] = local_408.super_BasicConstraint.name_.field_2._M_local_buf[0];
    local_338._8_8_ = local_408.super_BasicConstraint.name_._M_string_length;
    local_408.super_BasicConstraint.name_._M_string_length = 0;
    local_408.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    if (local_408.lcr_.super_BasicConstraint.name_._M_string_length < 7) {
      local_338._32_8_ = local_338 + 0x38;
      local_338._40_8_ = 6;
      local_408.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
      if (local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity != 0) {
        memcpy((void *)local_338._32_8_,local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
               local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity * 8);
      }
    }
    else {
      local_338._32_8_ = local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p;
      local_338._40_8_ = local_408.lcr_.super_BasicConstraint.name_._M_string_length;
      local_408.lcr_.super_BasicConstraint.name_._M_string_length = 6;
      local_408.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity = 0;
      local_408.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
      local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)((long)&local_408.lcr_.super_BasicConstraint.name_.field_2 + 8);
    }
    if ((ulong)local_408.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3] < 7) {
      local_2d0 = (type)((long)local_338 + 0x80);
      local_2c8 = (type)0x6;
      if (local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.m_storage.m_data[4] != (type)0x0) {
        memcpy((void *)local_2d0,
               (void *)local_408.lcr_.super_LinTerms.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data
                       [2],
               (long)local_408.lcr_.super_LinTerms.coefs_.
                     super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4]
               * 4);
      }
    }
    else {
      local_2d0 = local_408.lcr_.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2];
      local_2c8 = local_408.lcr_.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3];
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[3] = (type)0x6;
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[4] = (type)0x0;
      local_408.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[2] =
           (type)((long)&local_408.lcr_.super_LinTerms.coefs_.
                         super_small_vector_base<std::allocator<double>,_6U> + 0x40);
    }
    local_2a0.rhs_ =
         (double)local_408.lcr_.super_LinTerms.vars_.
                 super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    NVar12 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)this_00,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)local_338
                       );
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(this_00,NVar12);
    if (6 < (ulong)local_2c8) {
      operator_delete((void *)local_2d0,(long)local_2c8 << 2);
    }
    if (6 < (ulong)local_338._40_8_) {
      operator_delete((void *)local_338._32_8_,local_338._40_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
    }
    if (6 < (ulong)local_408.lcr_.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3]) {
      operator_delete((void *)local_408.lcr_.super_LinTerms.coefs_.
                              super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                              m_data[2],
                      (long)local_408.lcr_.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                            m_data[3] << 2);
    }
    if (6 < local_408.lcr_.super_BasicConstraint.name_._M_string_length) {
      operator_delete(local_408.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_408.lcr_.super_BasicConstraint.name_._M_string_length << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.super_BasicConstraint.name_._M_dataplus._M_p != paVar1) goto LAB_0030ff89;
  }
  bVar7 = true;
LAB_0030ff98:
  if (6 < local_d8.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_d8.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d8.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_d8.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_d8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_d8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_d8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  if (6 < local_100) {
    operator_delete(local_108,local_100 << 2);
  }
  if (6 < (ulong)local_150._8_8_) {
    operator_delete((void *)local_150._0_8_,local_150._8_8_ << 3);
  }
  return bVar7;
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }